

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Median_patch64(int g_a,int64_t *alo,int64_t *ahi,int g_b,int64_t *blo,int64_t *bhi,int g_c,
                      int64_t *clo,int64_t *chi,int g_m,int64_t *mlo,int64_t *mhi)

{
  Integer IVar1;
  Integer IVar2;
  Integer IVar3;
  long lVar4;
  long lVar5;
  Integer _ga_mhi [7];
  Integer _ga_mlo [7];
  Integer _ga_chi [7];
  Integer _ga_clo [7];
  Integer _ga_bhi [7];
  Integer _ga_blo [7];
  Integer _ga_ahi [7];
  Integer _ga_alo [7];
  
  IVar1 = pnga_ndim((long)g_a);
  IVar2 = pnga_ndim((long)g_b);
  IVar3 = pnga_ndim((long)g_c);
  lVar4 = pnga_ndim((long)g_m);
  lVar5 = IVar1;
  if (0 < IVar1) {
    do {
      _ga_alo[lVar5 + -1] = *alo + 1;
      alo = alo + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (0 < IVar1) {
      do {
        _ga_ahi[IVar1 + -1] = *ahi + 1;
        ahi = ahi + 1;
        IVar1 = IVar1 + -1;
      } while (IVar1 != 0);
    }
  }
  lVar5 = IVar2;
  if (0 < IVar2) {
    do {
      _ga_blo[lVar5 + -1] = *blo + 1;
      blo = blo + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (0 < IVar2) {
      do {
        _ga_bhi[IVar2 + -1] = *bhi + 1;
        bhi = bhi + 1;
        IVar2 = IVar2 + -1;
      } while (IVar2 != 0);
    }
  }
  lVar5 = IVar3;
  if (0 < IVar3) {
    do {
      _ga_clo[lVar5 + -1] = *clo + 1;
      clo = clo + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (0 < IVar3) {
      do {
        _ga_chi[IVar3 + -1] = *chi + 1;
        chi = chi + 1;
        IVar3 = IVar3 + -1;
      } while (IVar3 != 0);
    }
  }
  lVar5 = lVar4;
  if (0 < lVar4) {
    do {
      _ga_mlo[lVar5 + -1] = *mlo + 1;
      mlo = mlo + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    if (0 < lVar4) {
      do {
        _ga_mhi[lVar4 + -1] = *mhi + 1;
        mhi = mhi + 1;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
  }
  pnga_median_patch((long)g_a,_ga_alo,_ga_ahi,(long)g_b,_ga_blo,_ga_bhi,(long)g_c,_ga_clo,_ga_chi,
                    (long)g_m,_ga_mlo,_ga_mhi);
  return;
}

Assistant:

void GA_Median_patch64(int g_a, int64_t *alo, int64_t *ahi,
                       int g_b, int64_t *blo, int64_t *bhi,
                       int g_c, int64_t *clo, int64_t *chi,
                       int g_m, int64_t *mlo, int64_t *mhi){

   Integer a = (Integer)g_a;
    Integer b = (Integer)g_b;
    Integer c = (Integer)g_c;
    Integer m = (Integer )g_m;
    Integer andim = wnga_ndim(a);
    Integer bndim = wnga_ndim(b);
    Integer cndim = wnga_ndim(c);
    Integer mndim = wnga_ndim(m);
    Integer _ga_alo[MAXDIM], _ga_ahi[MAXDIM];
    Integer _ga_blo[MAXDIM], _ga_bhi[MAXDIM];
    Integer _ga_clo[MAXDIM], _ga_chi[MAXDIM];
    Integer _ga_mlo[MAXDIM], _ga_mhi[MAXDIM];
    COPYINDEX_C2F(alo,_ga_alo, andim);
    COPYINDEX_C2F(ahi,_ga_ahi, andim);
    COPYINDEX_C2F(blo,_ga_blo, bndim);
    COPYINDEX_C2F(bhi,_ga_bhi, bndim);
    COPYINDEX_C2F(clo,_ga_clo, cndim);
    COPYINDEX_C2F(chi,_ga_chi, cndim);
    COPYINDEX_C2F(mlo,_ga_mlo, mndim);
    COPYINDEX_C2F(mhi,_ga_mhi, mndim);
    wnga_median_patch(a, _ga_alo, _ga_ahi, b, _ga_blo, _ga_bhi, c, _ga_clo, _ga_chi, m, _ga_mlo, _ga_mhi);
}